

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fluid.hpp
# Opt level: O1

void __thiscall Fluid::grid_to_particle(Fluid *this)

{
  PFNGLUNIFORM1FPROC p_Var1;
  PFNGLUNIFORM3FVPROC p_Var2;
  PFNGLUNIFORM3IVPROC p_Var3;
  GLint GVar4;
  long *local_b0 [2];
  long local_a0 [2];
  long *local_90 [2];
  long local_80 [2];
  long *local_70 [2];
  long local_60 [2];
  long *local_50 [2];
  long local_40 [2];
  
  (*glad_glMemoryBarrier)(0xffffffff);
  gfx::Program::use(&this->grid_to_particle_program);
  p_Var2 = glad_glUniform3fv;
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"bounds_min","");
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,(GLchar *)local_50[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_min);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  p_Var2 = glad_glUniform3fv;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"bounds_max","");
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,(GLchar *)local_70[0]);
  (*p_Var2)(GVar4,1,(GLfloat *)&this->bounds_max);
  if (local_70[0] != local_60) {
    operator_delete(local_70[0],local_60[0] + 1);
  }
  p_Var3 = glad_glUniform3iv;
  local_90[0] = local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"grid_dim","");
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,(GLchar *)local_90[0]);
  (*p_Var3)(GVar4,1,(GLint *)&this->grid_dimensions);
  if (local_90[0] != local_80) {
    operator_delete(local_90[0],local_80[0] + 1);
  }
  p_Var1 = glad_glUniform1f;
  local_b0[0] = local_a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"pic_flip_blend","");
  GVar4 = (*glad_glGetUniformLocation)((this->grid_to_particle_program).id,(GLchar *)local_b0[0]);
  (*p_Var1)(GVar4,this->pic_flip_blend);
  if (local_b0[0] != local_a0) {
    operator_delete(local_b0[0],local_a0[0] + 1);
  }
  (*glad_glValidateProgram)((this->grid_to_particle_program).id);
  gfx::Program::check_validation
            (&this->grid_to_particle_program,(this->grid_to_particle_program).id);
  (*glad_glDispatchCompute)((this->particle_ssbo)._length,1,1);
  (*glad_glUseProgram)(0);
  return;
}

Assistant:

void grid_to_particle() {
        ssbo_barrier();
        grid_to_particle_program.use();
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_min"), 1, glm::value_ptr(bounds_min));
        glUniform3fv(grid_to_particle_program.uniform_loc("bounds_max"), 1, glm::value_ptr(bounds_max));
        glUniform3iv(grid_to_particle_program.uniform_loc("grid_dim"), 1, glm::value_ptr(grid_dimensions));
        glUniform1f(grid_to_particle_program.uniform_loc("pic_flip_blend"), pic_flip_blend);
        grid_to_particle_program.validate();
        glDispatchCompute(particle_ssbo.length(), 1, 1);
        grid_to_particle_program.disuse();
    }